

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDictElement
          (AsciiParser *this,string *out_key,MetaVariable *out_var)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  uint64_t uVar3;
  long lVar4;
  bool bVar5;
  uint32_t uVar6;
  const_iterator cVar7;
  long *plVar8;
  ostream *poVar9;
  uint uVar10;
  _Rb_tree_header *p_Var11;
  uint *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  bool bVar17;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  token val;
  PrimVar var;
  MetaVariable metavar;
  string type_name;
  string key_name;
  bool local_319;
  string local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b0 [4];
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a0;
  undefined2 uStack_290;
  undefined2 uStack_28e;
  float fStack_28c;
  float local_288;
  float fStack_284;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_280;
  double local_270;
  double dStack_268;
  double local_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  storage_union local_230;
  undefined **local_220;
  undefined1 local_218;
  undefined1 local_210 [17];
  undefined8 uStack_1ff;
  storage_union local_1f0;
  undefined **local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined8 local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [4];
  ios_base local_180 [264];
  string *local_78;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar5 = ReadIdentifier(this,&local_70);
  if (!bVar5) {
LAB_0036edc4:
    bVar5 = false;
    goto LAB_0036edc6;
  }
  bVar5 = SkipWhitespace(this);
  if (!bVar5) goto LAB_0036edc4;
  cVar7 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->_supported_prim_attr_types,&local_70);
  p_Var11 = &(this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar7._M_node == p_Var11) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x2fa);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
                     ,"Unknown or unsupported type `",&local_70);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_230);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      aStack_2a0._8_8_ = plVar8[3];
      aStack_2a0._M_allocated_capacity._0_4_ = (undefined4)paVar12->_M_allocated_capacity;
      aStack_2a0._M_allocated_capacity._4_4_ = (undefined4)(paVar12->_M_allocated_capacity >> 0x20);
      _local_2b0 = &aStack_2a0;
    }
    else {
      aStack_2a0._M_allocated_capacity._0_4_ = (undefined4)paVar12->_M_allocated_capacity;
      aStack_2a0._M_allocated_capacity._4_4_ = (undefined4)(paVar12->_M_allocated_capacity >> 0x20);
      _local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar8;
    }
    lVar4 = plVar8[1];
    fStack_2a8 = (float)lVar4;
    fStack_2a4 = (float)((ulong)lVar4 >> 0x20);
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1f0,(char *)_local_2b0,lVar4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_2b0 != &aStack_2a0) {
      operator_delete((void *)_local_2b0,
                      CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                               aStack_2a0._M_allocated_capacity._0_4_) + 1);
    }
    if ((undefined ***)local_230.dynamic != &local_220) {
      operator_delete(local_230.dynamic,(long)local_220 + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_2b0 != &aStack_2a0) {
      operator_delete((void *)_local_2b0,
                      CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                               aStack_2a0._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    ::std::ios_base::~ios_base(local_180);
    goto LAB_0036edc4;
  }
  pSVar2 = this->_sr;
  uVar13 = pSVar2->length_;
  uVar14 = pSVar2->idx_ + 1;
  if (uVar14 <= uVar13) {
    uVar1 = pSVar2->binary_[pSVar2->idx_];
    pSVar2->idx_ = uVar14;
    p_Var11 = (_Rb_tree_header *)(ulong)(uVar1 == '[');
  }
  uVar10 = (uint)p_Var11;
  if (uVar13 < uVar14) {
LAB_0036ea67:
    bVar5 = false;
    uVar13 = 0;
  }
  else {
    uVar3 = pSVar2->idx_;
    if (((ulong)p_Var11 & 1) == 0) {
      bVar5 = false;
      uVar14 = uVar3 - 1;
      if ((long)uVar14 < 0) goto LAB_0036ea67;
      uVar13 = 0;
      if (uVar14 <= pSVar2->length_) {
        pSVar2->idx_ = uVar14;
        bVar5 = true;
        uVar13 = (ulong)p_Var11 & 0xffffffff;
      }
    }
    else {
      uVar14 = uVar3 + 1;
      bVar5 = uVar14 <= uVar13;
      if (uVar13 < uVar14) {
        uVar10 = 0;
        bVar17 = true;
      }
      else {
        uVar1 = pSVar2->binary_[uVar3];
        pSVar2->idx_ = uVar14;
        bVar17 = uVar1 == ']';
      }
      uVar13 = (ulong)uVar10;
      if (!bVar17) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x30e);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"Invalid syntax found.",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fStack_2ac,local_2b0),
                          CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                   aStack_2a0._M_allocated_capacity._0_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
        ::std::ios_base::~ios_base(local_180);
        goto LAB_0036ea67;
      }
    }
  }
  if (!bVar5) goto LAB_0036edc4;
  bVar5 = SkipWhitespace(this);
  if (!bVar5) goto LAB_0036edc4;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar5 = ReadIdentifier(this,&local_50);
  if ((bVar5) || (bVar5 = ReadStringLiteral(this,&local_50), bVar5)) {
    bVar5 = SkipWhitespace(this);
    if ((!bVar5) || ((bVar5 = Expect(this,'='), !bVar5 || (bVar5 = SkipWhitespace(this), !bVar5))))
    goto LAB_0036f046;
    uVar6 = tinyusdz::value::GetTypeId(&local_70);
    local_220 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_230.dynamic = (undefined ***)0x0;
    local_218 = 0;
    local_210._0_8_ = (pointer)0x0;
    local_210[8] = 0;
    local_210._9_7_ = 0;
    local_210[0x10] = 0;
    uStack_1ff = 0;
    args = &switchD_0036eb53::switchdataD_0040cc80;
    local_78 = out_key;
    switch(uVar6) {
    case 6:
      if ((uVar13 & 1) == 0) {
        _local_2b0 = &aStack_2a0;
        fStack_2a8 = 0.0;
        fStack_2a4 = 0.0;
        aStack_2a0._M_allocated_capacity._0_4_ =
             (uint)(uint3)aStack_2a0._M_allocated_capacity._1_3_ << 8;
        local_319 = ReadBasicType(this,(token *)local_2b0);
        if (local_319) {
          linb::any::operator=((any *)&local_230,(Token *)local_2b0);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
          local_2c8._M_allocated_capacity._0_6_ = 0x6e656b6f74;
          local_2d8._8_8_ = 5;
          local_2d8._M_allocated_capacity = (size_type)&local_2c8;
          fmt::format<std::__cxx11::string>
                    ((string *)&local_318,(fmt *)local_2f8._M_local_buf,(string *)&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1f0,local_318._M_dataplus._M_p,
                              local_318._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_allocated_capacity != &local_2c8) {
            operator_delete((void *)local_2d8._M_allocated_capacity,
                            local_2c8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
            operator_delete((void *)local_2f8._M_allocated_capacity,
                            local_2e8._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_2b0 != &aStack_2a0) {
LAB_00373aba:
          uVar14 = CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                            aStack_2a0._M_allocated_capacity._0_4_) + 1;
          _Var16._M_p = (pointer)_local_2b0;
LAB_00376a33:
          operator_delete((void *)_local_2b0,uVar14);
          _local_2b0 = _Var16._M_p;
        }
      }
      else {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::Token>
                              (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    &local_2d8);
        if (local_319) {
          linb::any::operator=
                    ((any *)&local_230,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_2d8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x6e656b6f74;
          local_2f8._8_8_ = 5;
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)&local_318,(string *)&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1f0,(char *)CONCAT44(fStack_2ac,local_2b0),
                              CONCAT44(fStack_2a4,fStack_2a8));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
            operator_delete((void *)local_2f8._M_allocated_capacity,
                            local_2e8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_2d8);
      }
      break;
    case 7:
      if ((uVar13 & 1) == 0) {
        fStack_2a8 = 0.0;
        fStack_2a4 = 0.0;
        aStack_2a0._M_allocated_capacity._0_4_ =
             (uint)(uint3)aStack_2a0._M_allocated_capacity._1_3_ << 8;
        uStack_290._0_1_ = false;
        uStack_290._1_1_ = false;
        fStack_28c = 0.0;
        local_288 = 0.0;
        _local_2b0 = &aStack_2a0;
        local_319 = ReadBasicType(this,(StringData *)local_2b0);
        if (local_319) {
          linb::any::operator=((any *)&local_230,(StringData *)local_2b0);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x35f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"Failed to parse `string`",0x18);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_2b0 != &aStack_2a0) goto LAB_00373aba;
      }
      else {
        local_318._M_dataplus._M_p = (pointer)0x0;
        local_318._M_string_length = 0;
        local_318.field_2._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::StringData>
                              (this,(vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                     *)&local_318);
        if (local_319) {
          linb::any::operator=
                    ((any *)&local_230,
                     (vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      *)&local_318);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x359);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"Failed to parse `string[]`",0x1a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
        ~vector((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *
                )&local_318);
        _local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT44(fStack_2ac,local_2b0);
      }
      break;
    default:
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,"ParseDictElement",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
      poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x381);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,"Unsupported or invalid type for Metadatum:",&local_70);
      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1f0,(char *)CONCAT44(fStack_2ac,local_2b0),
                          CONCAT44(fStack_2a4,fStack_2a8));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2ac,local_2b0),
                        CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                 aStack_2a0._M_allocated_capacity._0_4_) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2ac,local_2b0),
                        CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                 aStack_2a0._M_allocated_capacity._0_4_) + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      ::std::ios_base::~ios_base(local_180);
      goto LAB_00372f91;
    case 9:
      if ((uVar13 & 1) == 0) {
        local_319 = ReadBasicType(this,(bool *)local_2d8._M_local_buf);
        if (local_319) {
          linb::any::operator=((any *)&local_230,(bool *)local_2d8._M_local_buf);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x6c6f6f62;
LAB_003751e3:
          local_2f8._8_8_ = 4;
          local_2e8._M_local_buf[4] = 0;
LAB_00376b1b:
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)&local_318,(string *)&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1f0,(char *)CONCAT44(fStack_2ac,local_2b0),
                              CONCAT44(fStack_2a4,fStack_2a8));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
LAB_00376b81:
            operator_delete((void *)local_2f8._M_allocated_capacity,
                            local_2e8._M_allocated_capacity + 1);
          }
LAB_00376b8e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            uVar15 = CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                              aStack_2a0._M_allocated_capacity._0_4_);
            _Var16._M_p = (pointer)CONCAT44(fStack_2ac,local_2b0);
LAB_00376bda:
            operator_delete(_Var16._M_p,uVar15 + 1);
          }
LAB_00376be2:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
      }
      else {
        local_2b0 = (undefined1  [4])0x0;
        fStack_2ac = 0.0;
        fStack_2a8 = 0.0;
        aStack_2a0._M_allocated_capacity._0_4_ = 0;
        aStack_2a0._M_allocated_capacity._4_4_ = 0;
        aStack_2a0._8_8_ = aStack_2a0._8_8_ & 0xffffffff00000000;
        uStack_290._0_1_ = false;
        uStack_290._1_1_ = false;
        uStack_28e = 0;
        fStack_28c = 0.0;
        local_319 = ParseBasicTypeArray<bool>(this,(vector<bool,_std::allocator<bool>_> *)local_2b0)
        ;
        if (local_319) {
          linb::any::operator=((any *)&local_230,(vector<bool,_std::allocator<bool>_> *)local_2b0);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"Failed to parse a value of type `{}[]`","");
          local_2d8._8_8_ = 4;
          local_2c8._M_allocated_capacity._0_5_ = 0x6c6f6f62;
          local_2d8._M_allocated_capacity = (size_type)&local_2c8;
          fmt::format<std::__cxx11::string>
                    ((string *)&local_318,(fmt *)local_2f8._M_local_buf,(string *)&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1f0,local_318._M_dataplus._M_p,
                              local_318._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_allocated_capacity != &local_2c8) {
            operator_delete((void *)local_2d8._M_allocated_capacity,
                            local_2c8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
            operator_delete((void *)local_2f8._M_allocated_capacity,
                            local_2e8._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_2b0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)_local_2b0,
                          CONCAT44(fStack_28c,CONCAT22(uStack_28e,uStack_290)) - _local_2b0);
          _local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          fStack_2a8 = 0.0;
          aStack_2a0._M_allocated_capacity._0_4_ = 0;
          aStack_2a0._M_allocated_capacity._4_4_ = 0;
          aStack_2a0._8_8_ = aStack_2a0._8_8_ & 0xffffffff00000000;
          uStack_290._0_1_ = false;
          uStack_290._1_1_ = false;
          uStack_28e = 0;
          fStack_28c = 0.0;
        }
      }
      break;
    case 0xe:
      if ((uVar13 & 1) == 0) {
        local_319 = ReadBasicType(this,(half *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
          goto LAB_003751e3;
        }
        linb::any::operator=((any *)&local_230,(half *)&local_2d8);
      }
      else {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::half>
                              (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                     *)&local_2d8);
        if (local_319) {
          linb::any::operator=
                    ((any *)&local_230,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &local_2d8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_0037510d:
          local_2f8._8_8_ = 4;
          local_2e8._M_local_buf[4] = 0;
LAB_00376935:
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)&local_318,(string *)&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1f0,(char *)CONCAT44(fStack_2ac,local_2b0),
                              CONCAT44(fStack_2a4,fStack_2a8));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) {
LAB_0037699b:
            operator_delete((void *)local_2f8._M_allocated_capacity,
                            local_2e8._M_allocated_capacity + 1);
          }
LAB_003769a8:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
LAB_00376a1d:
        _Var16._M_p = (pointer)CONCAT44(fStack_2ac,local_2b0);
        _local_2b0 = _Var16._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar14 = local_2c8._M_allocated_capacity - local_2d8._0_8_;
          _local_2b0 = local_2d8._M_allocated_capacity;
          goto LAB_00376a33;
        }
      }
      break;
    case 0xf:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2f8._M_allocated_capacity = (size_type)&local_2e8;
          local_2e8._M_allocated_capacity._0_4_ = 0x746e69;
          local_2f8._8_8_ = 3;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)&local_318,(string *)&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1f0,(char *)CONCAT44(fStack_2ac,local_2b0),
                              CONCAT44(fStack_2a4,fStack_2a8));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_allocated_capacity != &local_2e8) goto LAB_0037699b;
          goto LAB_003769a8;
        }
        linb::any::operator=((any *)&local_230,(vector<int,_std::allocator<int>_> *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(int *)local_2d8._M_local_buf);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        local_2e8._M_allocated_capacity._0_4_ = 0x746e69;
        local_2f8._8_8_ = 3;
        fmt::format<std::__cxx11::string>
                  ((string *)local_2b0,(fmt *)&local_318,(string *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1f0,(char *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(fStack_2a4,fStack_2a8));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fStack_2ac,local_2b0),
                          CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                   aStack_2a0._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_allocated_capacity != &local_2e8) goto LAB_00376b81;
        goto LAB_00376b8e;
      }
      linb::any::operator=((any *)&local_230,(int *)local_2d8._M_local_buf);
      break;
    case 0x10:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<long>
                              (this,(vector<long,_std::allocator<long>_> *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x36746e69;
LAB_003752b9:
          local_2e8._M_allocated_capacity._4_2_ = 0x34;
LAB_00375e3d:
          local_2f8._8_8_ = 5;
          goto LAB_00376935;
        }
        linb::any::operator=((any *)&local_230,(vector<long,_std::allocator<long>_> *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(int64_t *)local_2d8._M_local_buf);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x36746e69;
LAB_00375389:
        local_2e8._M_allocated_capacity._4_2_ = 0x34;
LAB_00375f15:
        local_2f8._8_8_ = 5;
        goto LAB_00376b1b;
      }
      linb::any::operator=((any *)&local_230,(long *)local_2d8._M_local_buf);
      break;
    case 0x11:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                              (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_00373b8f:
          local_2e8._M_allocated_capacity._4_2_ = 0x32;
          goto LAB_00375e3d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(half2 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_00373c5f:
        local_2e8._M_allocated_capacity._4_2_ = 0x32;
        goto LAB_00375f15;
      }
      linb::any::operator=((any *)&local_230,(array<tinyusdz::value::half,_2UL> *)&local_2d8);
      break;
    case 0x12:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                              (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_00373d2f:
          local_2e8._M_allocated_capacity._4_2_ = 0x33;
          goto LAB_00375e3d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(half3 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
LAB_00373dff:
        local_2e8._M_allocated_capacity._4_2_ = 0x33;
        goto LAB_00375f15;
      }
      linb::any::operator=((any *)&local_230,(array<tinyusdz::value::half,_3UL> *)&local_2d8);
      break;
    case 0x13:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                              (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
          goto LAB_003752b9;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(half4 *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x666c6168;
        goto LAB_00375389;
      }
      linb::any::operator=
                ((any *)&local_230,
                 (array<tinyusdz::value::half,_4UL> *)&local_2d8._M_allocated_capacity);
      break;
    case 0x14:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<int,2ul>>
                              (this,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x32746e69;
          goto LAB_0037510d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(int2 *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x32746e69;
        goto LAB_003751e3;
      }
      linb::any::operator=((any *)&local_230,(array<int,_2UL> *)&local_2d8._M_allocated_capacity);
      break;
    case 0x15:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<int,3ul>>
                              (this,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x33746e69;
          goto LAB_0037510d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(int3 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x33746e69;
        goto LAB_003751e3;
      }
      linb::any::operator=((any *)&local_230,(array<int,_3UL> *)&local_2d8);
      break;
    case 0x16:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<int,4ul>>
                              (this,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x34746e69;
          goto LAB_0037510d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(int4 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x34746e69;
        goto LAB_003751e3;
      }
      linb::any::operator=((any *)&local_230,(array<int,_4UL> *)&local_2d8);
      break;
    case 0x1b:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<unsigned_int>
                              (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    &local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
          goto LAB_0037510d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(uint32_t *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_003751e3;
      }
      linb::any::operator=((any *)&local_230,(uint *)&local_2d8._M_allocated_capacity);
      break;
    case 0x1c:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<unsigned_long>
                              (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x3436746e6975;
LAB_00375add:
          local_2f8._8_8_ = 6;
          local_2e8._M_local_buf[6] = 0;
          goto LAB_00376935;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x3436746e6975;
LAB_00375bb9:
        local_2f8._8_8_ = 6;
        local_2e8._M_local_buf[6] = 0;
        goto LAB_00376b1b;
      }
      linb::any::operator=((any *)&local_230,&local_2d8._M_allocated_capacity);
      break;
    case 0x25:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                              (this,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
          goto LAB_00373b8f;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(uint2 *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_00373c5f;
      }
      linb::any::operator=
                ((any *)&local_230,(array<unsigned_int,_2UL> *)&local_2d8._M_allocated_capacity);
      break;
    case 0x26:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                              (this,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
          goto LAB_00373d2f;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(uint3 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_00373dff;
      }
      linb::any::operator=((any *)&local_230,(array<unsigned_int,_3UL> *)&local_2d8);
      break;
    case 0x27:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                              (this,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
          goto LAB_003752b9;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(uint4 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_4_ = 0x746e6975;
        goto LAB_00375389;
      }
      linb::any::operator=((any *)&local_230,(array<unsigned_int,_4UL> *)&local_2d8);
      break;
    case 0x28:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<float>
                              (this,(vector<float,_std::allocator<float>_> *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x74616f6c66;
          goto LAB_00375e3d;
        }
        linb::any::operator=((any *)&local_230,(vector<float,_std::allocator<float>_> *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(float *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x74616f6c66;
        goto LAB_00375f15;
      }
      linb::any::operator=((any *)&local_230,(float *)&local_2d8);
      break;
    case 0x29:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<float,2ul>>
                              (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x3274616f6c66;
          goto LAB_00375add;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(float2 *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x3274616f6c66;
        goto LAB_00375bb9;
      }
      linb::any::operator=((any *)&local_230,(array<float,_2UL> *)&local_2d8._M_allocated_capacity);
      break;
    case 0x2a:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<float,3ul>>
                              (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x3374616f6c66;
          goto LAB_00375add;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(float3 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x3374616f6c66;
        goto LAB_00375bb9;
      }
      linb::any::operator=((any *)&local_230,(array<float,_3UL> *)&local_2d8);
      break;
    case 0x2b:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<float,4ul>>
                              (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x3474616f6c66;
          goto LAB_00375add;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(float4 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x3474616f6c66;
        goto LAB_00375bb9;
      }
      linb::any::operator=((any *)&local_230,(array<float,_4UL> *)&local_2d8);
      break;
    case 0x2c:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<double>
                              (this,(vector<double,_std::allocator<double>_> *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x656c62756f64;
          goto LAB_00375add;
        }
        linb::any::operator=
                  ((any *)&local_230,(vector<double,_std::allocator<double>_> *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(double *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x656c62756f64;
        goto LAB_00375bb9;
      }
      linb::any::operator=((any *)&local_230,(double *)&local_2d8._M_allocated_capacity);
      break;
    case 0x2d:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<double,2ul>>
                              (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x32656c62756f64;
LAB_0037619c:
          local_2f8._8_8_ = 7;
          goto LAB_00376935;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(double2 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x32656c62756f64;
LAB_00376279:
        local_2f8._8_8_ = 7;
        goto LAB_00376b1b;
      }
      linb::any::operator=((any *)&local_230,(array<double,_2UL> *)&local_2d8);
      break;
    case 0x2e:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<double,3ul>>
                              (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x33656c62756f64;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(double3 *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x33656c62756f64;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(array<double,_3UL> *)&local_2d8);
      break;
    case 0x2f:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<std::array<double,4ul>>
                              (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x34656c62756f64;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(double4 *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity._0_7_ = 0x34656c62756f64;
LAB_003748c9:
        local_2d8._8_8_ = 7;
        local_2c8._M_local_buf[7] = 0;
LAB_00376430:
        local_2d8._M_allocated_capacity = (size_type)&local_2c8;
        fmt::format<std::__cxx11::string>
                  ((string *)&local_318,(fmt *)local_2f8._M_local_buf,(string *)&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1f0,local_318._M_dataplus._M_p,
                            local_318._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_allocated_capacity != &local_2c8) {
          operator_delete((void *)local_2d8._M_allocated_capacity,
                          local_2c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_allocated_capacity != &local_2e8) {
          operator_delete((void *)local_2f8._M_allocated_capacity,
                          local_2e8._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_318);
        uVar15 = local_318.field_2._M_allocated_capacity;
        _Var16._M_p = local_318._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) goto LAB_00376bda;
        goto LAB_00376be2;
      }
      linb::any::operator=((any *)&local_230,(array<double,_4UL> *)local_2b0);
      break;
    case 0x30:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::quath>
                              (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x6874617571;
          goto LAB_00375e3d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(quath *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x6874617571;
        goto LAB_00375f15;
      }
      linb::any::operator=((any *)&local_230,(quath *)&local_2d8._M_allocated_capacity);
      break;
    case 0x31:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::quatf>
                              (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x6674617571;
          goto LAB_00375e3d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(quatf *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity._0_6_ = 0x6674617571;
        goto LAB_00375f15;
      }
      linb::any::operator=((any *)&local_230,(quatf *)&local_2d8);
      break;
    case 0x32:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::quatd>
                              (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity._0_6_ = 0x6474617571;
          goto LAB_00375e3d;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(quatd *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity._0_6_ = 0x6474617571;
        local_2d8._8_8_ = 5;
        goto LAB_00376430;
      }
      linb::any::operator=((any *)&local_230,(quatd *)local_2b0);
      break;
    case 0x33:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                              (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x663278697274616d;
LAB_00376766:
          local_2f8._8_8_ = 8;
          local_2e8._8_2_ = (ushort)(byte)local_2e8._M_local_buf[9] << 8;
          goto LAB_00376935;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_2d8._M_allocated_capacity = 0x3f800000;
      local_2d8._8_8_ = 0x3f80000000000000;
      local_319 = ReadBasicType(this,(matrix2f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x663278697274616d;
LAB_00376843:
        local_2f8._8_8_ = 8;
        local_2e8._8_2_ = (ushort)(byte)local_2e8._M_local_buf[9] << 8;
        goto LAB_00376b1b;
      }
      linb::any::operator=((any *)&local_230,(matrix2f *)&local_2d8);
      break;
    case 0x34:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                              (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x663378697274616d;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_2b0 = (undefined1  [4])0x3f800000;
      fStack_2ac = 0.0;
      fStack_2a8 = 0.0;
      fStack_2a4 = 0.0;
      aStack_2a0._M_allocated_capacity._0_4_ = 0x3f800000;
      aStack_2a0._M_allocated_capacity._4_4_ = 0;
      aStack_2a0._8_8_ = (float *)0x0;
      uStack_290._0_1_ = false;
      uStack_290._1_1_ = false;
      uStack_28e = 0x3f80;
      local_319 = ReadBasicType(this,(matrix3f *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity = 0x663378697274616d;
LAB_00376421:
        local_2d8._8_8_ = 8;
        local_2c8._M_local_buf[8] = '\0';
        goto LAB_00376430;
      }
      linb::any::operator=((any *)&local_230,(matrix3f *)local_2b0);
      break;
    case 0x35:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                              (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x663478697274616d;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_2b0 = (undefined1  [4])0x3f800000;
      fStack_2ac = 0.0;
      fStack_2a8 = 0.0;
      fStack_2a4 = 0.0;
      aStack_2a0._M_allocated_capacity._0_4_ = 0;
      aStack_2a0._M_allocated_capacity._4_4_ = 0x3f800000;
      aStack_2a0._8_8_ = (float *)0x0;
      uStack_290._0_1_ = false;
      uStack_290._1_1_ = false;
      uStack_28e = 0;
      fStack_28c = 0.0;
      local_288 = 1.0;
      fStack_284 = 0.0;
      aStack_280._M_allocated_capacity._0_4_ = 0;
      aStack_280._M_allocated_capacity._4_4_ = 0;
      aStack_280._8_4_ = 0;
      aStack_280._12_4_ = 0x3f800000;
      local_319 = ReadBasicType(this,(matrix4f *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity = 0x663478697274616d;
        goto LAB_00376421;
      }
      linb::any::operator=((any *)&local_230,(matrix4f *)local_2b0);
      break;
    case 0x36:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                              (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x643278697274616d;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_2b0 = (undefined1  [4])0x0;
      fStack_2ac = 1.875;
      fStack_2a8 = 0.0;
      fStack_2a4 = 0.0;
      aStack_2a0._M_allocated_capacity._0_4_ = 0;
      aStack_2a0._M_allocated_capacity._4_4_ = 0;
      aStack_2a0._8_8_ = (float *)0x3ff0000000000000;
      local_319 = ReadBasicType(this,(matrix2d *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity = 0x643278697274616d;
        goto LAB_00376421;
      }
      linb::any::operator=((any *)&local_230,(matrix2d *)local_2b0);
      break;
    case 0x37:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                              (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x643378697274616d;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_2b0 = (undefined1  [4])0x0;
      fStack_2ac = 1.875;
      fStack_2a8 = 0.0;
      fStack_2a4 = 0.0;
      aStack_2a0._M_allocated_capacity._0_4_ = 0;
      aStack_2a0._M_allocated_capacity._4_4_ = 0;
      args = (uint *)0x0;
      aStack_2a0._8_8_ = (float *)0x0;
      uStack_290._0_1_ = false;
      uStack_290._1_1_ = false;
      uStack_28e = 0;
      fStack_28c = 1.875;
      local_288 = 0.0;
      fStack_284 = 0.0;
      aStack_280._M_allocated_capacity._0_4_ = 0;
      aStack_280._M_allocated_capacity._4_4_ = 0;
      aStack_280._8_4_ = 0;
      aStack_280._12_4_ = 0;
      local_270 = 1.0;
      local_319 = ReadBasicType(this,(matrix3d *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity = 0x643378697274616d;
        goto LAB_00376421;
      }
      linb::any::operator=((any *)&local_230,(matrix3d *)local_2b0);
      break;
    case 0x38:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                              (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x643478697274616d;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_2b0 = (undefined1  [4])0x0;
      fStack_2ac = 1.875;
      fStack_2a8 = 0.0;
      fStack_2a4 = 0.0;
      aStack_2a0._M_allocated_capacity._0_4_ = 0;
      aStack_2a0._M_allocated_capacity._4_4_ = 0;
      aStack_2a0._8_8_ = (float *)0x0;
      uStack_290._0_1_ = false;
      uStack_290._1_1_ = false;
      uStack_28e = 0;
      fStack_28c = 0.0;
      local_288 = 0.0;
      fStack_284 = 1.875;
      aStack_280._M_allocated_capacity._0_4_ = 0;
      aStack_280._M_allocated_capacity._4_4_ = 0;
      aStack_280._8_4_ = 0;
      aStack_280._12_4_ = 0;
      local_270 = 0.0;
      dStack_268 = 0.0;
      local_260 = 1.0;
      local_258 = 0.0;
      dStack_250 = 0.0;
      local_248 = 0.0;
      dStack_240 = 0.0;
      local_238 = 1.0;
      local_319 = ReadBasicType(this,(matrix4d *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity = 0x643478697274616d;
        goto LAB_00376421;
      }
      linb::any::operator=((any *)&local_230,(matrix4d *)local_2b0);
      break;
    case 0x3a:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::color3f>
                              (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6633726f6c6f63;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(color3f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6633726f6c6f63;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(color3f *)&local_2d8);
      break;
    case 0x3b:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::color3d>
                              (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6433726f6c6f63;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(color3d *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6433726f6c6f63;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(color3d *)&local_2d8);
      break;
    case 0x3d:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::color4f>
                              (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6634726f6c6f63;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(color4f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6634726f6c6f63;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(color4f *)&local_2d8);
      break;
    case 0x3e:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::color4d>
                              (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6434726f6c6f63;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(color4d *)local_2b0);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_2f8._M_allocated_capacity = (size_type)&local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,"Failed to parse a value of type `{}`","");
        local_2c8._M_allocated_capacity._0_7_ = 0x6434726f6c6f63;
        goto LAB_003748c9;
      }
      linb::any::operator=((any *)&local_230,(color4d *)local_2b0);
      break;
    case 0x3f:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::point3h>
                              (this,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6833746e696f70;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(point3h *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6833746e696f70;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(point3h *)&local_2d8);
      break;
    case 0x40:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::point3f>
                              (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6633746e696f70;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(point3f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6633746e696f70;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(point3f *)&local_2d8);
      break;
    case 0x41:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::point3d>
                              (this,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6433746e696f70;
          goto LAB_0037619c;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(point3d *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6433746e696f70;
        goto LAB_00376279;
      }
      linb::any::operator=((any *)&local_230,(point3d *)&local_2d8);
      break;
    case 0x42:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                              (this,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x68336c616d726f6e;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(normal3h *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x68336c616d726f6e;
        goto LAB_00376843;
      }
      linb::any::operator=((any *)&local_230,(normal3h *)&local_2d8);
      break;
    case 0x43:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                              (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x66336c616d726f6e;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(normal3f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x66336c616d726f6e;
        goto LAB_00376843;
      }
      linb::any::operator=((any *)&local_230,(normal3f *)&local_2d8);
      break;
    case 0x44:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                              (this,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x64336c616d726f6e;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(normal3d *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x64336c616d726f6e;
        goto LAB_00376843;
      }
      linb::any::operator=((any *)&local_230,(normal3d *)&local_2d8);
      break;
    case 0x45:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                              (this,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6833726f74636576;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(vector3h *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6833726f74636576;
        goto LAB_00376843;
      }
      linb::any::operator=((any *)&local_230,(vector3h *)&local_2d8);
      break;
    case 0x46:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                              (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6633726f74636576;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(vector3f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6633726f74636576;
        goto LAB_00376843;
      }
      linb::any::operator=((any *)&local_230,(vector3f *)&local_2d8);
      break;
    case 0x47:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                              (this,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._M_allocated_capacity = 0x6433726f74636576;
          goto LAB_00376766;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(vector3d *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._M_allocated_capacity = 0x6433726f74636576;
        goto LAB_00376843;
      }
      linb::any::operator=((any *)&local_230,(vector3d *)&local_2d8);
      break;
    case 0x49:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                              (this,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._8_2_ = 0x6832;
LAB_00376929:
          local_2e8._M_allocated_capacity = 0x64726f6f43786574;
          local_2f8._8_8_ = 10;
          local_2e8._M_local_buf[10] = '\0';
          goto LAB_00376935;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(texcoord2h *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._8_2_ = 0x6832;
LAB_00376b0f:
        local_2e8._M_allocated_capacity = 0x64726f6f43786574;
        local_2f8._8_8_ = 10;
        local_2e8._M_local_buf[10] = '\0';
        goto LAB_00376b1b;
      }
      linb::any::operator=((any *)&local_230,(texcoord2h *)&local_2d8);
      break;
    case 0x4a:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                              (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._8_2_ = 0x6632;
          goto LAB_00376929;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(texcoord2f *)&local_2d8._M_allocated_capacity);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._8_2_ = 0x6632;
        goto LAB_00376b0f;
      }
      linb::any::operator=((any *)&local_230,(texcoord2f *)&local_2d8._M_allocated_capacity);
      break;
    case 0x4b:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                              (this,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._8_2_ = 0x6432;
          goto LAB_00376929;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(texcoord2d *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._8_2_ = 0x6432;
        goto LAB_00376b0f;
      }
      linb::any::operator=((any *)&local_230,(texcoord2d *)&local_2d8);
      break;
    case 0x4c:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                              (this,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._8_2_ = 0x6833;
          goto LAB_00376929;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(texcoord3h *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._8_2_ = 0x6833;
        goto LAB_00376b0f;
      }
      linb::any::operator=((any *)&local_230,(texcoord3h *)&local_2d8);
      break;
    case 0x4d:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                              (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._8_2_ = 0x6633;
          goto LAB_00376929;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(texcoord3f *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._8_2_ = 0x6633;
        goto LAB_00376b0f;
      }
      linb::any::operator=((any *)&local_230,(texcoord3f *)&local_2d8);
      break;
    case 0x4e:
      if ((uVar13 & 1) != 0) {
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2c8._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                              (this,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                     *)&local_2d8);
        if (!local_319) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Failed to parse a value of type `{}[]`","");
          local_2e8._8_2_ = 0x6433;
          goto LAB_00376929;
        }
        linb::any::operator=
                  ((any *)&local_230,
                   (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)&local_2d8);
        goto LAB_00376a1d;
      }
      local_319 = ReadBasicType(this,(texcoord3d *)&local_2d8);
      if (!local_319) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x353);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"Failed to parse a value of type `{}`","");
        local_2e8._8_2_ = 0x6433;
        goto LAB_00376b0f;
      }
      linb::any::operator=((any *)&local_230,(texcoord3d *)&local_2d8);
      break;
    case 0x51:
      if ((uVar13 & 1) == 0) {
        _local_2b0 = &aStack_2a0;
        fStack_2a8 = 0.0;
        fStack_2a4 = 0.0;
        aStack_2a0._M_allocated_capacity._0_4_ =
             (uint)(uint3)aStack_2a0._M_allocated_capacity._1_3_ << 8;
        uStack_290 = SUB82(&aStack_280,0);
        uStack_28e = (undefined2)((ulong)&aStack_280 >> 0x10);
        fStack_28c = (float)((ulong)&aStack_280 >> 0x20);
        local_288 = 0.0;
        fStack_284 = 0.0;
        aStack_280._M_allocated_capacity._0_4_ = aStack_280._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        local_319 = ReadBasicType(this,(AssetPath *)local_2b0);
        if (local_319) {
          linb::any::operator=((any *)&local_230,(AssetPath *)local_2b0);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x36f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"Failed to parse `asset`",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_2b0);
      }
      else {
        local_318._M_dataplus._M_p = (pointer)0x0;
        local_318._M_string_length = 0;
        local_318.field_2._M_allocated_capacity = 0;
        local_319 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                              (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                     *)&local_318);
        if (local_319) {
          linb::any::operator=
                    ((any *)&local_230,
                     (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                      *)&local_318);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"ParseDictElement",0x10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x369);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f0,"Failed to parse `asset[]`",0x19);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(fStack_2ac,local_2b0),
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          ::std::ios_base::~ios_base(local_180);
        }
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                &local_318);
        _local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT44(fStack_2ac,local_2b0);
      }
      break;
    case 0x52:
      aStack_2a0._8_8_ = &fStack_2a8;
      fStack_2a8 = 0.0;
      aStack_2a0._M_allocated_capacity._0_4_ = 0;
      aStack_2a0._M_allocated_capacity._4_4_ = 0;
      uStack_290 = (undefined2)aStack_2a0._8_8_;
      uStack_28e = (undefined2)((ulong)aStack_2a0._8_8_ >> 0x10);
      fStack_28c = (float)((ulong)aStack_2a0._8_8_ >> 0x20);
      local_288 = 0.0;
      fStack_284 = 0.0;
      local_319 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                  *)local_2b0);
      if (local_319) {
        linb::any::operator=
                  ((any *)&local_230,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_2b0);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"ParseDictElement",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x37a);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,"Failed to parse `dictionary`",0x1c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
        ::std::ios_base::~ios_base(local_180);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)local_2b0,
                 (_Link_type)
                 CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                          aStack_2a0._M_allocated_capacity._0_4_));
      _local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT44(fStack_2ac,local_2b0);
    }
    if (local_319 == false) {
LAB_00372f91:
      bVar5 = false;
    }
    else {
      local_1e0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_1f0.dynamic = (void *)0x0;
      local_1d8 = local_1c8;
      local_1d0 = 0;
      local_1c8[0]._M_local_buf[0] = '\0';
      linb::any::operator=((any *)&local_1f0,(any *)&local_230);
      ::std::__cxx11::string::_M_assign((string *)&local_1d8);
      ::std::__cxx11::string::_M_assign((string *)local_78);
      ::std::__cxx11::string::_M_assign((string *)&out_var->_name);
      linb::any::operator=((any *)out_var,(any *)&local_1f0);
      MetaVariable::~MetaVariable((MetaVariable *)&local_1f0);
      bVar5 = true;
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_210);
    if (local_220 != (undefined **)0x0) {
      (*(code *)local_220[4])(&local_230);
      local_220 = (undefined **)0x0;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,"ParseDictElement",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<(&local_1f0,0x322);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,"Failed to parse dictionary key identifier.\n",0x2b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_2ac,local_2b0) != &aStack_2a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_2ac,local_2b0),
                      CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                               aStack_2a0._M_allocated_capacity._0_4_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    ::std::ios_base::~ios_base(local_180);
LAB_0036f046:
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
LAB_0036edc6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool AsciiParser::ParseDictElement(std::string *out_key,
                                   MetaVariable *out_var) {
  (void)out_key;
  (void)out_var;

  // dict_element: type (array_qual?) name '=' value
  //           ;

  std::string type_name;

  if (!ReadIdentifier(&type_name)) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!IsSupportedPrimAttrType(type_name)) {
    PUSH_ERROR_AND_RETURN("Unknown or unsupported type `" + type_name + "`\n");
  }

  // Has array qualifier? `[]`
  bool array_qual = false;
  {
    char c0, c1;
    if (!Char1(&c0)) {
      return false;
    }

    if (c0 == '[') {
      if (!Char1(&c1)) {
        return false;
      }

      if (c1 == ']') {
        array_qual = true;
      } else {
        // Invalid syntax
        PUSH_ERROR_AND_RETURN("Invalid syntax found.");
      }

    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string key_name;
  if (!ReadIdentifier(&key_name)) {
    // string literal is also supported. e.g. "0"
    if (ReadStringLiteral(&key_name)) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse dictionary key identifier.\n");
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('=')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  uint32_t tyid = value::GetTypeId(type_name);

  primvar::PrimVar var;

  //
  // Supports limited types for customData/Dictionary.
  //

  // TODO: Unify code with ParseMetaValue()

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  switch (tyid) {
    APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
    case value::TYPE_ID_STRING: {
      // FIXME: Use std::string
      if (array_qual) {
        std::vector<value::StringData> strs;
        if (!ParseBasicTypeArray(&strs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
        }
        var.set_value(strs);
      } else {
        value::StringData str;
        if (!ReadBasicType(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string`");
        }
        var.set_value(str);
      }
      break;
    }
    case value::TYPE_ID_ASSET_PATH: {
      if (array_qual) {
        std::vector<value::AssetPath> arrs;
        if (!ParseBasicTypeArray(&arrs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
        }
        var.set_value(arrs);
      } else {
        value::AssetPath asset;
        if (!ReadBasicType(&asset)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
        }
        var.set_value(asset);
      }
      break;
    }
    case value::TYPE_ID_DICT: {
      Dictionary dict;

      DCOUT("Parse dictionary");
      if (!ParseDict(&dict)) {
        PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
      }
      var.set_value(dict);
      break;
    }
    default: {
      PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                            type_name);
    }
  }

#undef PARSE_BASE_TYPE

  MetaVariable metavar;
  metavar.set_value(key_name, var.value_raw());

  DCOUT("key: " << key_name << ", type: " << type_name);

  (*out_key) = key_name;
  (*out_var) = metavar;

  return true;
}